

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RSAPublicKey.cpp
# Opt level: O0

bool __thiscall RSAPublicKey::deserialise(RSAPublicKey *this,ByteString *serialised)

{
  size_t sVar1;
  long *in_RDI;
  ByteString dE;
  ByteString dN;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  undefined1 local_68 [40];
  undefined1 local_40 [63];
  byte local_1;
  
  ByteString::chainDeserialise
            ((ByteString *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  ByteString::chainDeserialise
            ((ByteString *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  sVar1 = ByteString::size((ByteString *)0x151454);
  if (sVar1 != 0) {
    sVar1 = ByteString::size((ByteString *)0x151470);
    if (sVar1 != 0) {
      (**(code **)(*in_RDI + 0x30))(in_RDI,local_40);
      (**(code **)(*in_RDI + 0x38))(in_RDI,local_68);
      local_1 = 1;
      goto LAB_001514f8;
    }
  }
  local_1 = 0;
LAB_001514f8:
  ByteString::~ByteString((ByteString *)0x151502);
  ByteString::~ByteString((ByteString *)0x15150c);
  return (bool)(local_1 & 1);
}

Assistant:

bool RSAPublicKey::deserialise(ByteString& serialised)
{
	ByteString dN = ByteString::chainDeserialise(serialised);
	ByteString dE = ByteString::chainDeserialise(serialised);

	if ((dN.size() == 0) ||
	    (dE.size() == 0))
	{
		return false;
	}

	setN(dN);
	setE(dE);

	return true;
}